

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O3

void __thiscall implementations::scheme::SchemeFrame::execute(SchemeFrame *this)

{
  SubframeMode SVar1;
  bool bVar2;
  int iVar3;
  runtime_error *this_00;
  cell res;
  cell local_70;
  
  iVar3 = (*(this->
            super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
            )._vptr_Frame[2])();
  if ((char)iVar3 == '\0') {
    if (this->subframe == (SchemeFrame *)0x0) {
      if ((this->arg_it)._M_current !=
          (this->arguments).
          super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        nextArgument(this);
        return;
      }
      bVar2 = dispatchCall(this);
      if (bVar2) {
        nextExpression(this);
        return;
      }
    }
    else {
      execute(this->subframe);
      iVar3 = (*(this->subframe->
                super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                )._vptr_Frame[2])();
      if ((char)iVar3 != '\0') {
        cell::cell(&local_70,
                   &(this->subframe->
                    super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                    ).result);
        SVar1 = this->subframe_mode;
        if (this->subframe != (SchemeFrame *)0x0) {
          (*(this->subframe->
            super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
            )._vptr_Frame[1])();
        }
        this->subframe = (SchemeFrame *)0x0;
        this->subframe_mode = None;
        if (SVar1 == Procedure) {
          (this->
          super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
          ).result.type = local_70.type;
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(this->
                      super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                      ).result.val);
          std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
          ::operator=(&(this->
                       super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                       ).result.list,&local_70.list);
          (this->
          super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
          ).result.proc = local_70.proc;
          (this->
          super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
          ).result.env.
          super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = local_70.env.
                   super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(this->
                      super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                      ).result.env.
                      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,
                     &local_70.env.
                      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          nextExpression(this);
        }
        else {
          if (SVar1 != Argument) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Invalid subframe mode None");
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
          ::push_back(&this->resolved_arguments,&local_70);
          (this->arg_it)._M_current = (this->arg_it)._M_current + 1;
          nextArgument(this);
        }
        if (local_70.env.
            super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_70.env.
                     super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
        ~vector(&local_70.list);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.val._M_dataplus._M_p != &local_70.val.field_2) {
          operator_delete(local_70.val._M_dataplus._M_p,
                          local_70.val.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void execute() {
		if (isResolved())
			return;
		if (subframe != nullptr) {
			subframe->execute();
			if (subframe->isResolved()) {
				// Copy results
				cell res(subframe->result);
				auto mode = subframe_mode;
				DEBUG("  subframe(" + std::string((mode == Argument ? "arg" : "proc")) + ") = " + to_string(res));
				// Clear subframe
				delete subframe;
				subframe = nullptr;
				subframe_mode = None;
				// Do something with result
				switch (mode) {
				case Argument:
					resolved_arguments.push_back(res);
					++arg_it;
					nextArgument();
					break;
				case Procedure:
					result = res;
					nextExpression();
					break;
				default:
					throw std::runtime_error("Invalid subframe mode None");
				}
			}
		}  else if (arg_it == arguments.cend())
			dispatch();
		else
			nextArgument();
	}